

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_cookie.c
# Opt level: O0

int ssl_cookie_hmac(mbedtls_md_context_t *hmac_ctx,uchar *time,uchar **p,uchar *end,uchar *cli_id,
                   size_t cli_id_len)

{
  uchar *puVar1;
  int iVar2;
  undefined8 local_68;
  uchar hmac_out [32];
  size_t cli_id_len_local;
  uchar *cli_id_local;
  uchar *end_local;
  uchar **p_local;
  uchar *time_local;
  mbedtls_md_context_t *hmac_ctx_local;
  
  iVar2 = mbedtls_ssl_chk_buf_ptr(*p,end,0x1c);
  if (iVar2 == 0) {
    iVar2 = mbedtls_md_hmac_reset(hmac_ctx);
    if ((((iVar2 == 0) && (iVar2 = mbedtls_md_hmac_update(hmac_ctx,time,4), iVar2 == 0)) &&
        (iVar2 = mbedtls_md_hmac_update(hmac_ctx,cli_id,cli_id_len), iVar2 == 0)) &&
       (iVar2 = mbedtls_md_hmac_finish(hmac_ctx,(uchar *)&local_68), iVar2 == 0)) {
      puVar1 = *p;
      *(undefined8 *)puVar1 = local_68;
      *(undefined8 *)(puVar1 + 8) = hmac_out._0_8_;
      *(undefined8 *)(puVar1 + 0x10) = hmac_out._8_8_;
      *(undefined4 *)(puVar1 + 0x18) = hmac_out._16_4_;
      *p = *p + 0x1c;
      return 0;
    }
    hmac_ctx_local._4_4_ = -0x6c00;
  }
  else {
    hmac_ctx_local._4_4_ = -0x6a00;
  }
  return hmac_ctx_local._4_4_;
}

Assistant:

MBEDTLS_CHECK_RETURN_CRITICAL
static int ssl_cookie_hmac(mbedtls_md_context_t *hmac_ctx,
                           const unsigned char time[4],
                           unsigned char **p, unsigned char *end,
                           const unsigned char *cli_id, size_t cli_id_len)
{
    unsigned char hmac_out[COOKIE_MD_OUTLEN];

    MBEDTLS_SSL_CHK_BUF_PTR(*p, end, COOKIE_HMAC_LEN);

    if (mbedtls_md_hmac_reset(hmac_ctx) != 0 ||
        mbedtls_md_hmac_update(hmac_ctx, time, 4) != 0 ||
        mbedtls_md_hmac_update(hmac_ctx, cli_id, cli_id_len) != 0 ||
        mbedtls_md_hmac_finish(hmac_ctx, hmac_out) != 0) {
        return MBEDTLS_ERR_SSL_INTERNAL_ERROR;
    }

    memcpy(*p, hmac_out, COOKIE_HMAC_LEN);
    *p += COOKIE_HMAC_LEN;

    return 0;
}